

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_int>::Run
          (MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_int> *this)

{
  bool bVar1;
  code *pcVar2;
  long *plVar3;
  
  bVar1 = this->self_deleting_;
  pcVar2 = (code *)this->method_;
  plVar3 = (long *)((long)&(this->object_->super_Test)._vptr_Test + *(long *)&this->field_0x18);
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *plVar3 + -1);
  }
  (*pcVar2)(plVar3,this->arg1_);
  if (bVar1 != false) {
    (*(this->super_Closure)._vptr_Closure[1])(this);
    return;
  }
  return;
}

Assistant:

void Run() override {
    bool needs_delete = self_deleting_;  // read in case callback deletes
    (object_->*method_)(arg1_);
    if (needs_delete) delete this;
  }